

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::Reflection::IsInlinedStringDonated
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *has_bit_set;
  LogMessage local_50;
  Voidify local_39;
  uint local_38;
  uint local_34;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldDescriptor *pFStack_20;
  uint32_t index;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pFStack_20 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  absl_log_internal_check_op_result._4_4_ =
       internal::ReflectionSchema::InlinedStringIndex(&this->schema_,field);
  local_34 = absl::lts_20250127::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._4_4_);
  local_38 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_30 = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                       (&local_34,&local_38,"index > 0u");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xbc3,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  has_bit_set = GetInlinedStringDonatedArray(this,(Message *)field_local);
  bVar1 = anon_unknown_6::IsIndexInHasBitSet(has_bit_set,absl_log_internal_check_op_result._4_4_);
  return bVar1;
}

Assistant:

bool Reflection::IsInlinedStringDonated(const Message& message,
                                        const FieldDescriptor* field) const {
  uint32_t index = schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  return IsIndexInHasBitSet(GetInlinedStringDonatedArray(message), index);
}